

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O1

double __thiscall Lesson::score(Lesson *this,double avg_score)

{
  double dVar1;
  pointer pPVar2;
  pointer pPVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  float fVar10;
  undefined1 auVar11 [16];
  double dVar12;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> a;
  allocator_type local_71;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  double local_48 [7];
  
  local_48[4] = 0.2;
  local_48[5] = 0.1;
  local_48[2] = 0.3;
  local_48[3] = 0.2;
  local_48[0] = 0.1;
  local_48[1] = 0.4;
  local_48[6] = 0.1;
  __l._M_len = 7;
  __l._M_array = local_48;
  local_70 = avg_score;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l,&local_71);
  pPVar2 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->lesson_id;
  iVar5 = (int)this->lesson_id;
  iVar7 = SUB164(auVar4 * ZEXT816(0x2492492492492493),8);
  pPVar3 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 == pPVar3) {
    dVar12 = local_70 / 5.0 + 0.0;
  }
  else {
    lVar6 = ((long)pPVar3 - (long)pPVar2 >> 4) * 0x2e8ba2e8ba2e8ba3;
    lVar8 = lVar6 + (ulong)(lVar6 == 0);
    pdVar9 = &pPVar2->total;
    dVar12 = 0.0;
    do {
      dVar12 = dVar12 + *pdVar9 / 5.0;
      pdVar9 = pdVar9 + 0x16;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = 0x45300000;
    dVar12 = dVar12 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  }
  dVar1 = *(double *)
           ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
           (ulong)(((((uint)(iVar5 - iVar7) >> 1) + iVar7 >> 2) * -7 + iVar5) * 8));
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    local_70 = dVar12;
    local_68 = dVar1;
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    dVar12 = local_70;
    dVar1 = local_68;
  }
  fVar10 = roundf((float)((dVar1 + dVar12) * 1000.0));
  return (double)(fVar10 / 1000.0);
}

Assistant:

double Lesson::score(double avg_score)
{
    double professor_score = 0;
    std::vector <double> a = {0.1, 0.4, 0.3, 0.2, 0.2, 0.1, 0.1};
    double location_score = a[lesson_id%7];
    if (!prep_list.empty()) {
        for(int i = 0; i < prep_list.size(); i++){
            professor_score+= double(prep_list[i].total)/5;
        }
        professor_score = professor_score/prep_list.size();
    }
    else {
        professor_score+= double(avg_score)/5;
    }

    return roundf((professor_score + location_score) * 1000 )/ 1000;
}